

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Dtc_ObjComputeTruth_rec(Gia_Obj_t *pObj)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = pObj->Value;
  if (uVar2 == 0) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                    ,0xec,"int Dtc_ObjComputeTruth_rec(Gia_Obj_t *)");
    }
    uVar3 = Dtc_ObjComputeTruth_rec(pObj + -(ulong)uVar2);
    uVar2 = Dtc_ObjComputeTruth_rec(pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar4 = Gia_ObjIsXor(pObj);
    lVar1 = *(long *)pObj;
    uVar5 = (int)lVar1 * 4;
    if (iVar4 == 0) {
      uVar2 = ((int)uVar5 >> 0x1f ^ uVar3) & (uVar2 ^ (uint)((lVar1 << 2) >> 0x3f));
    }
    else {
      uVar2 = (int)(uVar5 ^ (uint)((ulong)(lVar1 << 2) >> 0x20)) >> 0x1f ^ uVar3 ^ uVar2;
    }
    pObj->Value = uVar2;
  }
  return uVar2;
}

Assistant:

int Dtc_ObjComputeTruth_rec( Gia_Obj_t * pObj )
{
    int Truth0, Truth1;
    if ( pObj->Value )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Truth0 = Dtc_ObjComputeTruth_rec( Gia_ObjFanin0(pObj) );
    Truth1 = Dtc_ObjComputeTruth_rec( Gia_ObjFanin1(pObj) );
    if ( Gia_ObjIsXor(pObj) )
        return (pObj->Value = (Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0) ^ (Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1));
    else
        return (pObj->Value = (Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0) & (Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1));
}